

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileLexer.c
# Opt level: O1

void cmListFileLexerAppend(cmListFileLexer *lexer,char *text,int length)

{
  int *piVar1;
  int iVar2;
  char *__src;
  char *__dest;
  size_t __n;
  size_t __size;
  long lVar3;
  size_t __n_00;
  
  iVar2 = (lexer->token).length;
  __n = (size_t)iVar2;
  __n_00 = (size_t)length;
  __src = (lexer->token).text;
  if ((__src == (char *)0x0) || (lexer->size <= length + iVar2)) {
    __size = __n_00 + __n + 1;
    __dest = (char *)malloc(__size);
    if (__src != (char *)0x0) {
      memcpy(__dest,__src,__n);
      free(__src);
    }
    lVar3 = (long)(lexer->token).length;
    memcpy(__dest + lVar3,text,__n_00);
    lVar3 = lVar3 + __n_00;
    __dest[lVar3] = '\0';
    (lexer->token).text = __dest;
    (lexer->token).length = (int)lVar3;
    lexer->size = (int)__size;
  }
  else {
    strcpy(__src + __n,text);
    piVar1 = &(lexer->token).length;
    *piVar1 = *piVar1 + length;
  }
  return;
}

Assistant:

static void cmListFileLexerAppend(cmListFileLexer* lexer, const char* text,
                                  int length)
{
  char* temp;
  int newSize;

  /* If the appended text will fit in the buffer, do not reallocate.  */
  newSize = lexer->token.length + length + 1;
  if (lexer->token.text && newSize <= lexer->size) {
    strcpy(lexer->token.text + lexer->token.length, text);
    lexer->token.length += length;
    return;
  }

  /* We need to extend the buffer.  */
  temp = malloc(newSize);
  if (lexer->token.text) {
    memcpy(temp, lexer->token.text, lexer->token.length);
    free(lexer->token.text);
  }
  memcpy(temp + lexer->token.length, text, length);
  temp[lexer->token.length + length] = 0;
  lexer->token.text = temp;
  lexer->token.length += length;
  lexer->size = newSize;
}